

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O2

void Lpk_CreateCommonOrder
               (char (*pTable) [16],int *piCofVar,int nCBars,int *pPrios,int nVars,int fVerbose)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int Score [16];
  int pPres [16];
  
  Score[0xc] = 0;
  Score[0xd] = 0;
  Score[0xe] = 0;
  Score[0xf] = 0;
  Score[8] = 0;
  Score[9] = 0;
  Score[10] = 0;
  Score[0xb] = 0;
  Score[4] = 0;
  Score[5] = 0;
  Score[6] = 0;
  Score[7] = 0;
  Score[0] = 0;
  Score[1] = 0;
  Score[2] = 0;
  Score[3] = 0;
  uVar2 = 0;
  uVar8 = 0;
  if (0 < nVars) {
    uVar8 = (ulong)(uint)nVars;
  }
  for (; uVar8 != uVar2; uVar2 = uVar2 + 1) {
    pPres[uVar2] = 1;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)nCBars;
  if (nCBars < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pPres[piCofVar[uVar3]] = 0;
  }
  uVar2 = 0;
  pcVar5 = *pTable;
  for (; uVar2 != uVar8; uVar2 = uVar2 + 1) {
    if (pPres[uVar2] != 0) {
      for (uVar3 = 0; (uint)nVars != uVar3; uVar3 = uVar3 + 1) {
        Score[uVar2] = Score[uVar2] + (int)(*pTable)[uVar3];
      }
      for (lVar6 = 0; (ulong)(uint)nVars << 4 != lVar6; lVar6 = lVar6 + 0x10) {
        Score[uVar2] = Score[uVar2] - (int)pcVar5[lVar6];
      }
    }
    pTable = pTable + 1;
    pcVar5 = pcVar5 + 1;
  }
  if (fVerbose != 0) {
    printf("Scores: ");
    for (uVar2 = 0; uVar8 != uVar2; uVar2 = uVar2 + 1) {
      printf("%c=%d ",(ulong)((int)uVar2 + 0x61),(ulong)(uint)Score[uVar2]);
    }
    printf("   ");
    printf("Prios: ");
  }
  for (uVar2 = 0; uVar8 != uVar2; uVar2 = uVar2 + 1) {
    pPrios[uVar2] = 0x10;
  }
  uVar4 = 1;
  while( true ) {
    iVar7 = -100000;
    uVar2 = 0xffffffffffffffff;
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      if (pPres[uVar3] != 0) {
        iVar1 = Score[uVar3];
        if (iVar7 < iVar1) {
          uVar2 = uVar3;
        }
        uVar2 = uVar2 & 0xffffffff;
        if (iVar7 <= iVar1) {
          iVar7 = iVar1;
        }
      }
    }
    if ((int)uVar2 == -1) break;
    if (fVerbose != 0) {
      printf("%d=",(ulong)uVar4);
    }
    for (uVar2 = 0; uVar8 != uVar2; uVar2 = uVar2 + 1) {
      if ((pPres[uVar2] != 0) && (Score[uVar2] == iVar7)) {
        pPrios[uVar2] = uVar4;
        pPres[uVar2] = 0;
        if (fVerbose != 0) {
          putchar((int)uVar2 + 0x61);
        }
      }
    }
    if (fVerbose != 0) {
      putchar(0x20);
    }
    uVar4 = uVar4 + 1;
  }
  if (fVerbose != 0) {
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Lpk_CreateCommonOrder( char pTable[][16], int piCofVar[], int nCBars, int pPrios[], int nVars, int fVerbose )
{
    int Score[16] = {0}, pPres[16];
    int i, y, x, iVarBest, ScoreMax, PrioCount;

    // mark the present variables
    for ( i = 0; i < nVars; i++ )
        pPres[i] = 1;
    // remove cofactored variables
    for ( i = 0; i < nCBars; i++ )
        pPres[piCofVar[i]] = 0;

    // compute scores for each leaf
    for ( i = 0; i < nVars; i++ )
    {
        if ( pPres[i] == 0 )
            continue;
        for ( y = 0; y < nVars; y++ )
            Score[i] += pTable[i][y];
        for ( x = 0; x < nVars; x++ )
            Score[i] -= pTable[x][i];
    }

    // print the scores
    if ( fVerbose )
    {
        printf( "Scores: " );
        for ( i = 0; i < nVars; i++ )
            printf( "%c=%d ", 'a'+i, Score[i] );
        printf( "   " );
        printf( "Prios: " );
    }

    // derive variable priority
    // variables with equal score receive the same priority
    for ( i = 0; i < nVars; i++ )
        pPrios[i] = 16;

    // iterate until variables remain
    for ( PrioCount = 1; ; PrioCount++ )
    {
        // find the present variable with the highest score
        iVarBest = -1;
        ScoreMax = -100000;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( ScoreMax < Score[i] )
            {
                ScoreMax = Score[i];
                iVarBest = i;
            }
        }
        if ( iVarBest == -1 )
            break;
        // give the next priority to all vars having this score
        if ( fVerbose )
            printf( "%d=", PrioCount );
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( Score[i] == ScoreMax )
            {
                pPrios[i] = PrioCount;
                pPres[i] = 0;
                if ( fVerbose )
                    printf( "%c", 'a'+i );
            }
        }
        if ( fVerbose )
            printf( " " );
    }
    if ( fVerbose )
        printf( "\n" );
}